

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3MaterializeView(Parse *pParse,Table *pView,Expr *pWhere,int iCur)

{
  uint uVar1;
  sqlite3 *db;
  Expr *pWhere_00;
  SrcList *pSrc;
  char *pcVar2;
  Select *p;
  ulong uVar3;
  ulong uVar4;
  Schema **ppSVar5;
  SelectDest dest;
  SelectDest local_48;
  
  db = pParse->db;
  if (pView->pSchema == (Schema *)0x0) {
    uVar4 = 0xfff0bdc0;
  }
  else {
    uVar1 = db->nDb;
    if ((int)uVar1 < 1) {
      uVar4 = 0;
    }
    else {
      ppSVar5 = &db->aDb->pSchema;
      uVar3 = 0;
      do {
        uVar4 = uVar3;
        if (*ppSVar5 == pView->pSchema) break;
        uVar3 = uVar3 + 1;
        ppSVar5 = ppSVar5 + 4;
        uVar4 = (ulong)uVar1;
      } while (uVar1 != uVar3);
    }
  }
  pWhere_00 = exprDup(db,pWhere,0,(u8 **)0x0);
  pSrc = sqlite3SrcListAppend(db,(SrcList *)0x0,(Token *)0x0,(Token *)0x0);
  if (pSrc != (SrcList *)0x0) {
    pcVar2 = sqlite3DbStrDup(db,pView->zName);
    pSrc->a[0].zName = pcVar2;
    pcVar2 = sqlite3DbStrDup(db,db->aDb[(int)uVar4].zName);
    pSrc->a[0].zDatabase = pcVar2;
  }
  p = sqlite3SelectNew(pParse,(ExprList *)0x0,pSrc,pWhere_00,(ExprList *)0x0,(Expr *)0x0,
                       (ExprList *)0x0,0,(Expr *)0x0,(Expr *)0x0);
  local_48.eDest = '\f';
  local_48.affSdst = '\0';
  local_48.iSdst = 0;
  local_48.nSdst = 0;
  local_48.iSDParm = iCur;
  sqlite3Select(pParse,p,&local_48);
  clearSelect(db,p,1);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3MaterializeView(
  Parse *pParse,       /* Parsing context */
  Table *pView,        /* View definition */
  Expr *pWhere,        /* Optional WHERE clause to be added */
  int iCur             /* Cursor number for ephemeral table */
){
  SelectDest dest;
  Select *pSel;
  SrcList *pFrom;
  sqlite3 *db = pParse->db;
  int iDb = sqlite3SchemaToIndex(db, pView->pSchema);
  pWhere = sqlite3ExprDup(db, pWhere, 0);
  pFrom = sqlite3SrcListAppend(db, 0, 0, 0);
  if( pFrom ){
    assert( pFrom->nSrc==1 );
    pFrom->a[0].zName = sqlite3DbStrDup(db, pView->zName);
    pFrom->a[0].zDatabase = sqlite3DbStrDup(db, db->aDb[iDb].zName);
    assert( pFrom->a[0].pOn==0 );
    assert( pFrom->a[0].pUsing==0 );
  }
  pSel = sqlite3SelectNew(pParse, 0, pFrom, pWhere, 0, 0, 0, 0, 0, 0);
  sqlite3SelectDestInit(&dest, SRT_EphemTab, iCur);
  sqlite3Select(pParse, pSel, &dest);
  sqlite3SelectDelete(db, pSel);
}